

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O3

vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_> * __thiscall
pbrt::ParameterDictionary::extractSpectrumArray
          (vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>
           *__return_storage_ptr__,ParameterDictionary *this,ParsedParameter *param,
          SpectrumType spectrumType,Allocator alloc)

{
  double dVar1;
  ulong uVar2;
  double *pdVar3;
  size_type sVar4;
  Allocator alloc_00;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  void *pvVar7;
  undefined8 uVar8;
  int iVar9;
  RGBIlluminantSpectrum *this_00;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  iterator iVar10;
  mapped_type *pmVar11;
  uintptr_t uVar12;
  string *name;
  ulong uVar13;
  char *fmt;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  size_type sVar19;
  size_t i;
  RGBColorSpace *cs;
  ulong uVar20;
  span<const_float> l;
  span<const_float> v;
  string fn;
  vector<float,_std::allocator<float>_> value;
  char *local_258;
  memory_resource *local_248;
  undefined1 local_240 [12];
  undefined4 uStack_234;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_230;
  ParameterDictionary *local_220;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
  local_218;
  undefined1 local_210 [72];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  FileLoc local_198;
  vector<double,_pstd::pmr::polymorphic_allocator<double>_> local_180;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_160;
  vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> local_140;
  ParsedParameter local_108;
  memory_resource **local_38;
  undefined4 extraout_var;
  
  local_248 = alloc.memoryResource;
  local_220 = this;
  iVar9 = std::__cxx11::string::compare((char *)param);
  if ((iVar9 == 0) ||
     ((*(char *)(Options + 0x2d) == '\x01' &&
      (iVar9 = std::__cxx11::string::compare((char *)param), iVar9 == 0)))) {
    local_210._0_4_ = 3;
    uVar2 = (param->numbers).nStored;
    if (uVar2 == 0) {
      ErrorExit<std::__cxx11::string_const&>
                (&param->loc,"No values provided for \"%s\".",&param->name);
    }
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar2;
    if (0x5555555555555555 < SUB168(auVar6 * ZEXT816(0xaaaaaaaaaaaaaaab),0)) {
      ErrorExit<std::__cxx11::string_const&,int&>
                (&param->loc,"Number of values provided for \"%s\" not a multiple of %d",
                 &param->name,(int *)local_210);
    }
    param->lookedUp = true;
    std::vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>::vector
              (__return_storage_ptr__,uVar2 / 3,(allocator_type *)local_240);
    if (2 < uVar2) {
      lVar18 = 2;
      uVar13 = 0;
      local_258 = "RGB parameter \"%s\" has negative component.";
      do {
        pdVar3 = (param->numbers).ptr;
        local_240._8_4_ = (undefined4)pdVar3[lVar18];
        auVar6 = vcvtpd2ps_avx(*(undefined1 (*) [16])(pdVar3 + lVar18 + -2));
        local_240._0_8_ = vmovlps_avx(auVar6);
        cs = param->colorSpace;
        if (cs == (RGBColorSpace *)0x0) {
          cs = local_220->colorSpace;
        }
        if (auVar6._0_4_ < 0.0) {
LAB_0038cd46:
          ErrorExit<std::__cxx11::string_const&>(&param->loc,local_258,&param->name);
        }
        auVar5 = vmovshdup_avx(auVar6);
        if ((auVar5._0_4_ < 0.0) || ((float)local_240._8_4_ < 0.0)) goto LAB_0038cd46;
        if (spectrumType == Illuminant) {
          iVar9 = (*local_248->_vptr_memory_resource[2])(local_248,0x18,8);
          this_00 = (RGBIlluminantSpectrum *)CONCAT44(extraout_var_01,iVar9);
          RGBIlluminantSpectrum::RGBIlluminantSpectrum(this_00,cs,(RGB *)local_240);
          uVar20 = 0x6000000000000;
        }
        else if (spectrumType == Unbounded) {
          iVar9 = (*local_248->_vptr_memory_resource[2])(local_248,0x10,4);
          this_00 = (RGBIlluminantSpectrum *)CONCAT44(extraout_var_00,iVar9);
          RGBUnboundedSpectrum::RGBUnboundedSpectrum
                    ((RGBUnboundedSpectrum *)this_00,cs,(RGB *)local_240);
          uVar20 = 0x5000000000000;
        }
        else {
          if (spectrumType != Albedo) {
            LogFatal<char_const(&)[41]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/paramdict.cpp"
                       ,0x188,"Check failed: %s",
                       (char (*) [41])"spectrumType == SpectrumType::Illuminant");
          }
          if (((1.0 < auVar6._0_4_) || (1.0 < auVar5._0_4_)) || (1.0 < (float)local_240._8_4_)) {
            local_258 = "RGB parameter \"%s\" has > 1 component.";
            goto LAB_0038cd46;
          }
          iVar9 = (*local_248->_vptr_memory_resource[2])(local_248,0xc,4);
          this_00 = (RGBIlluminantSpectrum *)CONCAT44(extraout_var,iVar9);
          RGBAlbedoSpectrum::RGBAlbedoSpectrum((RGBAlbedoSpectrum *)this_00,cs,(RGB *)local_240);
          uVar20 = 0x4000000000000;
        }
        lVar18 = lVar18 + 3;
        (__return_storage_ptr__->
        super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>)._M_impl.
        super__Vector_impl_data._M_start[uVar13].
        super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
        .bits = (ulong)this_00 | uVar20;
        uVar13 = uVar13 + 1;
      } while (uVar2 / 3 != uVar13);
    }
  }
  else {
    iVar9 = std::__cxx11::string::compare((char *)param);
    if (iVar9 == 0) {
      sVar4 = (param->numbers).nStored;
      if (sVar4 == 0) {
        fmt = "No values provided for \"%s\".";
LAB_0038cdef:
        ErrorExit<std::__cxx11::string_const&>(&param->loc,fmt,&param->name);
      }
      param->lookedUp = true;
      std::vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>::vector
                (__return_storage_ptr__,sVar4,(allocator_type *)local_240);
      sVar19 = 0;
      do {
        pdVar3 = (param->numbers).ptr;
        iVar9 = (*local_248->_vptr_memory_resource[2])(local_248,8,4);
        BlackbodySpectrum::BlackbodySpectrum
                  ((BlackbodySpectrum *)CONCAT44(extraout_var_02,iVar9),(float)pdVar3[sVar19]);
        (__return_storage_ptr__->
        super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>)._M_impl.
        super__Vector_impl_data._M_start[sVar19].
        super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
        .bits = CONCAT44(extraout_var_02,iVar9) | 0x7000000000000;
        sVar19 = sVar19 + 1;
      } while (sVar4 != sVar19);
    }
    else {
      iVar9 = std::__cxx11::string::compare((char *)param);
      if ((iVar9 == 0) && (uVar2 = (param->numbers).nStored, uVar2 != 0)) {
        if ((uVar2 & 1) != 0) {
          fmt = "Found odd number of values for \"%s\"";
          goto LAB_0038cdef;
        }
        local_210._32_8_ = local_220;
        local_210._48_8_ = &local_248;
        local_210._40_4_ = (undefined4)(uVar2 >> 1);
        ParsedParameter::ParsedParameter((ParsedParameter *)(local_210 + 0x38),param);
        local_210._28_4_ = (undefined4)uVar2;
        uVar2 = (param->numbers).nStored;
        if (uVar2 == 0) {
          ErrorExit<std::__cxx11::string_const&>
                    (&param->loc,"No values provided for \"%s\".",&param->name);
        }
        uVar13 = (ulong)(int)local_210._28_4_;
        if (uVar2 % uVar13 != 0) {
          ErrorExit<std::__cxx11::string_const&,int&>
                    (&param->loc,"Number of values provided for \"%s\" not a multiple of %d",
                     &param->name,(int *)(local_210 + 0x1c));
        }
        param->lookedUp = true;
        std::vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>::vector
                  (__return_storage_ptr__,uVar2 / uVar13,(allocator_type *)local_240);
        if (uVar13 <= uVar2) {
          lVar18 = 0;
          uVar20 = 0;
          local_220 = (ParameterDictionary *)(uVar13 * 8);
          do {
            pdVar3 = (param->numbers).ptr;
            std::vector<float,_std::allocator<float>_>::vector
                      ((vector<float,_std::allocator<float>_> *)local_240,
                       (long)(int)local_210._40_4_,(allocator_type *)local_210);
            std::vector<float,_std::allocator<float>_>::vector
                      ((vector<float,_std::allocator<float>_> *)local_210,
                       (long)(int)local_210._40_4_,(allocator_type *)&local_218);
            uVar8 = local_210._48_8_;
            if (0 < (long)(int)local_210._40_4_) {
              lVar14 = 4;
              iVar9 = -1;
              lVar15 = 0;
              lVar16 = 0;
              do {
                if (lVar16 == 0) {
                  dVar1 = pdVar3[uVar20 * uVar13];
                  lVar17 = 0;
                }
                else {
                  dVar1 = *(double *)((long)pdVar3 + lVar16 * 8 + lVar18);
                  lVar17 = lVar16;
                  if (dVar1 <= (double)*(float *)(local_240._0_8_ + lVar16 * 2 + -4)) {
                    local_218.bits._0_4_ = iVar9;
                    ErrorExit<int,float&,double_const&>
                              (&local_198,
                               "Spectrum description invalid: at %d\'th entry, wavelengths aren\'t increasing: %f >= %f."
                               ,(int *)&local_218,(float *)(local_240._0_8_ + -lVar14),
                               (double *)((long)pdVar3 + (lVar18 - lVar15)));
                  }
                }
                lVar14 = lVar14 + -4;
                iVar9 = iVar9 + 1;
                lVar15 = lVar15 + -0x10;
                *(float *)(local_240._0_8_ + lVar16 * 2) = (float)dVar1;
                *(float *)(CONCAT44(local_210._4_4_,local_210._0_4_) + lVar16 * 2) =
                     (float)(pdVar3 + uVar20 * uVar13)[lVar17 + 1];
                lVar16 = lVar16 + 2;
              } while ((long)(int)local_210._40_4_ * 2 != lVar16);
            }
            iVar9 = (*(*(memory_resource **)local_210._48_8_)->_vptr_memory_resource[2])
                              (*(memory_resource **)local_210._48_8_,0x40,8);
            l.n = CONCAT44(uStack_234,local_240._8_4_) - local_240._0_8_ >> 2;
            v.n = CONCAT71(local_210._9_7_,local_210[8]) -
                  (long)CONCAT44(local_210._4_4_,local_210._0_4_) >> 2;
            l.ptr = (float *)local_240._0_8_;
            v.ptr = (float *)CONCAT44(local_210._4_4_,local_210._0_4_);
            PiecewiseLinearSpectrum::PiecewiseLinearSpectrum
                      ((PiecewiseLinearSpectrum *)CONCAT44(extraout_var_03,iVar9),l,v,
                       *(memory_resource **)uVar8);
            pvVar7 = (void *)CONCAT44(local_210._4_4_,local_210._0_4_);
            if (pvVar7 != (void *)0x0) {
              operator_delete(pvVar7,local_210._16_8_ - (long)pvVar7);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_240._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              operator_delete((void *)local_240._0_8_,
                              local_230._M_allocated_capacity - local_240._0_8_);
            }
            lVar18 = (long)&(local_220->params).alloc.memoryResource + lVar18;
            (__return_storage_ptr__->
            super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>)._M_impl
            .super__Vector_impl_data._M_start[uVar20].
            super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
            .bits = CONCAT44(extraout_var_03,iVar9) | 0x3000000000000;
            uVar20 = uVar20 + 1;
          } while (uVar20 < uVar2 / uVar13);
        }
        pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::~vector
                  (&local_140);
        pstd::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_160);
        pstd::vector<double,_pstd::pmr::polymorphic_allocator<double>_>::~vector(&local_180);
        if (local_1b8 != &local_1a8) {
          operator_delete(local_1b8,local_1a8._M_allocated_capacity + 1);
        }
        local_108.type.field_2._M_allocated_capacity = local_1c8._M_allocated_capacity;
        local_108.type._M_dataplus._M_p = (pointer)local_210._56_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._56_8_ == &local_1c8) {
          return __return_storage_ptr__;
        }
      }
      else {
        iVar9 = std::__cxx11::string::compare((char *)param);
        if ((iVar9 != 0) || ((param->strings).nStored == 0)) {
          (__return_storage_ptr__->
          super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>)._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (__return_storage_ptr__->
          super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>)._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          (__return_storage_ptr__->
          super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          return __return_storage_ptr__;
        }
        ParsedParameter::ParsedParameter(&local_108,param);
        local_38 = &local_248;
        sVar4 = (param->strings).nStored;
        if (sVar4 == 0) {
          ErrorExit<std::__cxx11::string_const&>
                    (&param->loc,"No values provided for \"%s\".",&param->name);
        }
        param->lookedUp = true;
        std::vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>::vector
                  (__return_storage_ptr__,sVar4,(allocator_type *)local_240);
        lVar18 = 0;
        sVar19 = 0;
        do {
          name = (string *)((long)&(((param->strings).ptr)->_M_dataplus)._M_p + lVar18);
          GetNamedSpectrum((pbrt *)&local_218,name);
          if ((local_218.bits & 0xffffffffffff) == 0) {
            alloc_00.memoryResource = *local_38;
            ResolveFilename((string *)local_240,name);
            iVar10 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle>_>_>
                     ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle>_>_>
                             *)cachedSpectra_abi_cxx11_,(key_type *)local_240);
            if (iVar10._M_node == (_Base_ptr)(cachedSpectra_abi_cxx11_ + 8)) {
              PiecewiseLinearSpectrum::Read
                        ((PiecewiseLinearSpectrum *)local_210,(string *)local_240,alloc_00);
              if (local_210[8] == '\0') {
                uVar12 = 0;
              }
              else {
                pmVar11 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle>_>_>
                          ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle>_>_>
                                        *)cachedSpectra_abi_cxx11_,(key_type *)local_240);
                uVar12 = CONCAT44(local_210._4_4_,local_210._0_4_);
                (pmVar11->
                super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
                ).bits = uVar12;
                if (local_210[8] == '\0') {
                  LogFatal<char_const(&)[4]>
                            (Fatal,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                             ,0xea,"Check failed: %s",(char (*) [4])0x28683bc);
                }
              }
            }
            else {
              pmVar11 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle>_>_>
                        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle>_>_>
                                      *)cachedSpectra_abi_cxx11_,(key_type *)local_240);
              uVar12 = (pmVar11->
                       super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
                       ).bits;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_240._0_8_ != &local_230) {
              operator_delete((void *)local_240._0_8_,local_230._M_allocated_capacity + 1);
            }
            local_218.bits = uVar12;
            if ((uVar12 & 0xffffffffffff) == 0) {
              ErrorExit<std::__cxx11::string_const&>
                        (&local_108.loc,"%s: unable to read valid spectrum file",name);
            }
          }
          lVar18 = lVar18 + 0x20;
          (__return_storage_ptr__->
          super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>)._M_impl.
          super__Vector_impl_data._M_start[sVar19].
          super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
          .bits = local_218.bits;
          sVar19 = sVar19 + 1;
        } while (sVar4 != sVar19);
        pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::~vector
                  (&local_108.bools);
        pstd::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_108.strings);
        pstd::vector<double,_pstd::pmr::polymorphic_allocator<double>_>::~vector(&local_108.numbers)
        ;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108.name._M_dataplus._M_p != &local_108.name.field_2) {
          operator_delete(local_108.name._M_dataplus._M_p,
                          local_108.name.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108.type._M_dataplus._M_p == &local_108.type.field_2) {
          return __return_storage_ptr__;
        }
      }
      operator_delete(local_108.type._M_dataplus._M_p,
                      local_108.type.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<SpectrumHandle> ParameterDictionary::extractSpectrumArray(
    const ParsedParameter &param, SpectrumType spectrumType, Allocator alloc) const {
    if (param.type == "rgb" || (Options->upgrade && param.type == "color"))
        return returnArray<SpectrumHandle>(
            param.numbers, param, 3,
            [this, spectrumType, &alloc, &param](const double *v,
                                                 const FileLoc *loc) -> SpectrumHandle {
                RGB rgb(v[0], v[1], v[2]);
                const RGBColorSpace &cs =
                    param.colorSpace ? *param.colorSpace : *colorSpace;
                if (rgb.r < 0 || rgb.g < 0 || rgb.b < 0)
                    ErrorExit(loc, "RGB parameter \"%s\" has negative component.",
                              param.name);
                if (spectrumType == SpectrumType::Albedo) {
                    if (rgb.r > 1 || rgb.g > 1 || rgb.b > 1)
                        ErrorExit(loc, "RGB parameter \"%s\" has > 1 component.",
                                  param.name);
                    return alloc.new_object<RGBAlbedoSpectrum>(cs, rgb);
                } else if (spectrumType == SpectrumType::Unbounded) {
                    return alloc.new_object<RGBUnboundedSpectrum>(cs, rgb);
                } else {
                    CHECK(spectrumType == SpectrumType::Illuminant);
                    return alloc.new_object<RGBIlluminantSpectrum>(cs, rgb);
                }
            });
    else if (param.type == "blackbody")
        return returnArray<SpectrumHandle>(
            param.numbers, param, 1,
            [this, &alloc](const double *v, const FileLoc *loc) -> SpectrumHandle {
                return alloc.new_object<BlackbodySpectrum>(v[0]);
            });
    else if (param.type == "spectrum" && !param.numbers.empty()) {
        if (param.numbers.size() % 2 != 0)
            ErrorExit(&param.loc, "Found odd number of values for \"%s\"", param.name);

        int nSamples = param.numbers.size() / 2;
        return returnArray<SpectrumHandle>(
            param.numbers, param, param.numbers.size(),
            [this, nSamples, &alloc, param](const double *v,
                                            const FileLoc *Loc) -> SpectrumHandle {
                std::vector<Float> lambda(nSamples), value(nSamples);
                for (int i = 0; i < nSamples; ++i) {
                    if (i > 0 && v[2 * i] <= lambda[i - 1])
                        ErrorExit(&param.loc,
                                  "Spectrum description invalid: at %d'th entry, "
                                  "wavelengths aren't increasing: %f >= %f.",
                                  i - 1, lambda[i - 1], v[2 * i]);
                    lambda[i] = v[2 * i];
                    value[i] = v[2 * i + 1];
                }
                return alloc.new_object<PiecewiseLinearSpectrum>(lambda, value, alloc);
            });
    } else if (param.type == "spectrum" && !param.strings.empty())
        return returnArray<SpectrumHandle>(
            param.strings, param, 1,
            [param, &alloc](const std::string *s, const FileLoc *loc) -> SpectrumHandle {
                SpectrumHandle spd = GetNamedSpectrum(*s);
                if (spd)
                    return spd;

                spd = readSpectrumFromFile(*s, alloc);
                if (!spd)
                    ErrorExit(&param.loc, "%s: unable to read valid spectrum file", *s);
                return spd;
            });

    return {};
}